

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

int * parasail_result_get_similar_row(parasail_result_t *result)

{
  if (result == (parasail_result_t *)0x0) {
    parasail_result_get_similar_row_cold_2();
  }
  else {
    if ((~result->flag & 0x50000U) == 0) {
      return *(int **)((long)((result->field_4).trace)->trace_del_table + 0x10);
    }
    parasail_result_get_similar_row_cold_1();
  }
  return (int *)0x0;
}

Assistant:

int* parasail_result_get_similar_row(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_stats_rowcol(result));
    return result->stats->rowcols->similar_row;
}